

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lodtalk.cpp
# Opt level: O1

void loadKernel(void)

{
  VMContext *pVVar1;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  pVVar1 = context;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"runtime/runtime.lodtalk","");
  Lodtalk::VMContext::executeScriptFromFileNamed((string *)pVVar1);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return;
}

Assistant:

void loadKernel()
{
    context->executeScriptFromFileNamed("runtime/runtime.lodtalk");
}